

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HostAddress_p.cpp
# Opt level: O3

bool __thiscall BamTools::Internal::HostAddress::operator<(HostAddress *this,HostAddress *other)

{
  NetworkProtocol NVar1;
  NetworkProtocol NVar2;
  ulong uVar3;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  
  NVar1 = this->m_protocol;
  NVar2 = other->m_protocol;
  if (NVar1 != IPv6Protocol) {
    if ((NVar1 == IPv4Protocol) && (NVar2 == IPv4Protocol)) {
      return this->m_ip4Address < other->m_ip4Address;
    }
LAB_001646a6:
    return NVar1 < NVar2;
  }
  if (NVar2 != IPv6Protocol) goto LAB_001646a6;
  uVar6 = *(ulong *)(this->m_ip6Address).data;
  uVar5 = uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18 |
          (uVar6 & 0xff00000000) >> 8 | (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
          (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
  uVar6 = *(ulong *)(other->m_ip6Address).data;
  uVar6 = uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18 |
          (uVar6 & 0xff00000000) >> 8 | (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
          (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
  if (uVar5 == uVar6) {
    uVar6 = *(ulong *)((this->m_ip6Address).data + 8);
    uVar3 = *(ulong *)((other->m_ip6Address).data + 8);
    uVar5 = uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18 |
            (uVar6 & 0xff00000000) >> 8 | (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
            (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
    uVar6 = uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
            (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
            (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
    bVar4 = 0;
    if (uVar5 == uVar6) goto LAB_001646a2;
  }
  bVar4 = (byte)(-(uint)(uVar5 < uVar6) >> 0x18);
LAB_001646a2:
  return (bool)(bVar4 >> 7);
}

Assistant:

bool HostAddress::operator<(const HostAddress& other) const
{

    // if self is IPv4
    if (m_protocol == HostAddress::IPv4Protocol) {
        if (other.m_protocol == HostAddress::IPv4Protocol) {
            return m_ip4Address < other.m_ip4Address;
        }
    }

    // if self is IPv6
    else if (m_protocol == HostAddress::IPv6Protocol) {
        if (other.m_protocol == HostAddress::IPv6Protocol) {
            return (std::memcmp(&m_ip6Address, &other.m_ip6Address, sizeof(IPv6Address)) < 0);
        }
    }

    // otherwise compare protocol types
    return m_protocol < other.m_protocol;
}